

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view source,
          OutputFormat output)

{
  string_view source_00;
  string_view str;
  string_view str_00;
  string local_60;
  string_view source_local;
  
  source_local._M_str = source._M_str;
  source_local._M_len = source._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&source_local,(allocator<char> *)&local_60);
  if (output < RESPONSE) {
    source_00._M_str = source_local._M_str;
    source_00._M_len = source_local._M_len;
    ConvertDirectorySeparatorsForShell_abi_cxx11_(&local_60,this,source_00);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    str._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
    str._M_len = __return_storage_ptr__->_M_string_length;
    EscapeForShell_abi_cxx11_
              (&local_60,this,str,true,false,output == WATCOMQUOTE,output == NINJAMULTI,false);
  }
  else {
    if (output != RESPONSE) {
      return __return_storage_ptr__;
    }
    str_00._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
    str_00._M_len = __return_storage_ptr__->_M_string_length;
    EscapeForShell_abi_cxx11_(&local_60,this,str_00,false,false,false,false,true);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertToOutputFormat(cm::string_view source,
                                                     OutputFormat output) const
{
  std::string result(source);
  // Convert it to an output path.
  if (output == SHELL || output == WATCOMQUOTE || output == NINJAMULTI) {
    result = this->ConvertDirectorySeparatorsForShell(source);
    result = this->EscapeForShell(result, true, false, output == WATCOMQUOTE,
                                  output == NINJAMULTI);
  } else if (output == RESPONSE) {
    result = this->EscapeForShell(result, false, false, false, false, true);
  }
  return result;
}